

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftsnames.c
# Opt level: O1

FT_Error FT_Get_Sfnt_Name(FT_Face face,FT_UInt idx,FT_SfntName *aname)

{
  FT_UShort *pFVar1;
  FT_Memory pFVar2;
  FT_Stream stream;
  FT_Error FVar3;
  void *pvVar4;
  unsigned_long uVar5;
  ulong uVar6;
  bool bVar7;
  
  if (face == (FT_Face)0x0 || aname == (FT_SfntName *)0x0) {
    return 6;
  }
  if ((face->face_flags & 8) == 0) {
    return 6;
  }
  if (*(ushort *)&face[2].available_sizes <= idx) {
    return 6;
  }
  pvVar4 = face[2].generic.data;
  pFVar1 = (FT_UShort *)((long)pvVar4 + (ulong)idx * 0x20);
  uVar6 = (ulong)*(ushort *)((long)pvVar4 + (ulong)idx * 0x20 + 8);
  if ((uVar6 != 0) && (*(long *)(pFVar1 + 0xc) == 0)) {
    pFVar2 = face->memory;
    stream = face->stream;
    pvVar4 = (*pFVar2->alloc)(pFVar2,uVar6);
    if (pvVar4 == (void *)0x0) {
      pFVar1[0xc] = 0;
      pFVar1[0xd] = 0;
      pFVar1[0xe] = 0;
      pFVar1[0xf] = 0;
    }
    else {
      memset(pvVar4,0,uVar6);
      *(void **)(pFVar1 + 0xc) = pvVar4;
      uVar6 = *(ulong *)(pFVar1 + 8);
      if (stream->read == (FT_Stream_IoFunc)0x0) {
        bVar7 = uVar6 <= stream->size;
      }
      else {
        uVar5 = (*stream->read)(stream,uVar6,(uchar *)0x0,0);
        bVar7 = uVar5 == 0;
      }
      if (bVar7) {
        stream->pos = uVar6;
        FVar3 = FT_Stream_Read(stream,*(FT_Byte **)(pFVar1 + 0xc),(ulong)pFVar1[4]);
        if (FVar3 == 0) goto LAB_001380c7;
      }
    }
    if (*(void **)(pFVar1 + 0xc) != (void *)0x0) {
      (*pFVar2->free)(pFVar2,*(void **)(pFVar1 + 0xc));
    }
    pFVar1[0xc] = 0;
    pFVar1[0xd] = 0;
    pFVar1[0xe] = 0;
    pFVar1[0xf] = 0;
    pFVar1[4] = 0;
  }
LAB_001380c7:
  aname->platform_id = *pFVar1;
  aname->encoding_id = pFVar1[1];
  aname->language_id = pFVar1[2];
  aname->name_id = pFVar1[3];
  aname->string = *(FT_Byte **)(pFVar1 + 0xc);
  aname->string_len = (uint)pFVar1[4];
  return 0;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Get_Sfnt_Name( FT_Face       face,
                    FT_UInt       idx,
                    FT_SfntName  *aname )
  {
    FT_Error  error = FT_ERR( Invalid_Argument );


    if ( aname && face && FT_IS_SFNT( face ) )
    {
      TT_Face  ttface = (TT_Face)face;


      if ( idx < (FT_UInt)ttface->num_names )
      {
        TT_Name  entry = ttface->name_table.names + idx;


        /* load name on demand */
        if ( entry->stringLength > 0 && !entry->string )
        {
          FT_Memory  memory = face->memory;
          FT_Stream  stream = face->stream;


          if ( FT_NEW_ARRAY  ( entry->string, entry->stringLength ) ||
               FT_STREAM_SEEK( entry->stringOffset )                ||
               FT_STREAM_READ( entry->string, entry->stringLength ) )
          {
            FT_FREE( entry->string );
            entry->stringLength = 0;
          }
        }

        aname->platform_id = entry->platformID;
        aname->encoding_id = entry->encodingID;
        aname->language_id = entry->languageID;
        aname->name_id     = entry->nameID;
        aname->string      = (FT_Byte*)entry->string;
        aname->string_len  = entry->stringLength;

        error = FT_Err_Ok;
      }
    }

    return error;
  }